

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimam.cpp
# Opt level: O3

int __thiscall BtorSimArrayModel::copy(BtorSimArrayModel *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  uint64_t uVar1;
  uint64_t *puVar2;
  BtorSimBitVector *pBVar3;
  mapped_type *ppBVar4;
  _Hash_node_base *p_Var5;
  value_type i;
  key_type local_58;
  BtorSimBitVector *local_38;
  
  puVar2 = (uint64_t *)operator_new(0x58);
  uVar1 = this->element_width;
  *puVar2 = this->index_width;
  puVar2[1] = uVar1;
  puVar2[2] = 0;
  puVar2[3] = 0;
  puVar2[4] = (uint64_t)(puVar2 + 10);
  puVar2[5] = 1;
  puVar2[6] = 0;
  puVar2[7] = 0;
  *(undefined4 *)(puVar2 + 8) = 0x3f800000;
  puVar2[9] = 0;
  puVar2[10] = 0;
  p_Var5 = (this->data)._M_h._M_before_begin._M_nxt;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    do {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,p_Var5[1]._M_nxt,
                 (long)&(p_Var5[1]._M_nxt)->_M_nxt + (long)&(p_Var5[2]._M_nxt)->_M_nxt);
      local_38 = (BtorSimBitVector *)p_Var5[5]._M_nxt;
      pBVar3 = btorsim_bv_copy(local_38);
      ppBVar4 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BtorSimBitVector_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)(puVar2 + 4),&local_58);
      *ppBVar4 = pBVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  if (this->const_init != (BtorSimBitVector *)0x0) {
    pBVar3 = btorsim_bv_copy(this->const_init);
    puVar2[3] = (uint64_t)pBVar3;
  }
  return (int)puVar2;
}

Assistant:

BtorSimArrayModel*
BtorSimArrayModel::copy () const
{
  BtorSimArrayModel* res = new BtorSimArrayModel (index_width, element_width);
  for (auto i : data) res->data[i.first] = btorsim_bv_copy (i.second);
  if (const_init) res->const_init = btorsim_bv_copy (const_init);
  return res;
}